

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.cpp
# Opt level: O2

bool duckdb::TryCastErrorMessage::Operation<duckdb::string_t,duckdb::dtime_tz_t>
               (string_t input,dtime_tz_t *result,CastParameters *parameters)

{
  string_t str;
  bool bVar1;
  undefined8 unaff_RBX;
  bool in_R8B;
  undefined8 unaff_R12;
  string_t input_00;
  string sStackY_48;
  
  input_00.value._0_8_ = input.value._8_8_;
  input_00.value.pointer.ptr = (char *)result;
  bVar1 = TryCast::Operation<duckdb::string_t,duckdb::dtime_tz_t>
                    (input.value._0_8_,input_00,(dtime_tz_t *)(ulong)parameters->strict,in_R8B);
  if (!bVar1) {
    str.value.pointer.ptr = (char *)unaff_R12;
    str.value._0_8_ = unaff_RBX;
    Time::ConversionError_abi_cxx11_(str);
    HandleCastError::AssignError(&sStackY_48,parameters);
    ::std::__cxx11::string::~string((string *)&sStackY_48);
  }
  return bVar1;
}

Assistant:

bool TryCastErrorMessage::Operation(string_t input, dtime_tz_t &result, CastParameters &parameters) {
	if (!TryCast::Operation<string_t, dtime_tz_t>(input, result, parameters.strict)) {
		HandleCastError::AssignError(Time::ConversionError(input), parameters);
		return false;
	}
	return true;
}